

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfwoff.c
# Opt level: O0

int compare_offsets(void *a,void *b)

{
  FT_ULong offset2;
  FT_ULong offset1;
  WOFF_Table table2;
  WOFF_Table table1;
  void *b_local;
  void *a_local;
  
  if (*(ulong *)(*b + 8) < *(ulong *)(*a + 8)) {
    a_local._4_4_ = 1;
  }
  else if (*(ulong *)(*a + 8) < *(ulong *)(*b + 8)) {
    a_local._4_4_ = -1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

FT_COMPARE_DEF( int )
  compare_offsets( const void*  a,
                   const void*  b )
  {
    WOFF_Table  table1 = *(WOFF_Table*)a;
    WOFF_Table  table2 = *(WOFF_Table*)b;

    FT_ULong  offset1 = table1->Offset;
    FT_ULong  offset2 = table2->Offset;


    if ( offset1 > offset2 )
      return 1;
    else if ( offset1 < offset2 )
      return -1;
    else
      return 0;
  }